

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

char * al_fgets(ALLEGRO_FILE *f,char *buf,size_t max)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  uint8_t c;
  uint8_t c_1;
  byte local_2a;
  byte local_29;
  
  if (max != 0) {
    pcVar5 = buf;
    if (max == 1) {
LAB_00159f6c:
      *pcVar5 = '\0';
      return buf;
    }
    sVar3 = al_fread(f,&local_2a,1);
    if (sVar3 == 1) {
      lVar6 = max - 2;
      pcVar1 = buf + 1;
      do {
        pcVar5 = pcVar1;
        uVar4 = (uint)local_2a;
        pcVar5[-1] = local_2a;
        bVar7 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if ((bVar7) || (local_2a == 10)) break;
        sVar3 = al_fread(f,&local_29,1);
        uVar4 = 0xffffffff;
        pcVar1 = pcVar5 + 1;
        local_2a = local_29;
      } while (sVar3 == 1);
      if ((uVar4 != 0xffffffff) || (iVar2 = (*f->vtable->fi_ferror)(f), iVar2 == 0))
      goto LAB_00159f6c;
    }
  }
  return (char *)0x0;
}

Assistant:

char *al_fgets(ALLEGRO_FILE *f, char * const buf, size_t max)
{
   char *p = buf;
   int c;
   ASSERT(f);
   ASSERT(buf);

   /* Handle silly cases. */
   if (max == 0) {
      return NULL;
   }
   if (max == 1) {
      *buf = '\0';
      return buf;
   }

   /* Return NULL if already at end of file. */
   if ((c = al_fgetc(f)) == EOF) {
      return NULL;
   }

   /* Fill buffer until empty, or we reach a newline or EOF or error. */
   do {
      *p++ = c;
      max--;
      if (max == 1 || c == '\n')
         break;
      c = al_fgetc(f);
   } while (c != EOF);

   /* Return NULL on error. */
   if (c == EOF && al_ferror(f)) {
      return NULL;
   }

   /* Add null terminator. */
   ASSERT(max >= 1);
   *p = '\0';

   return buf;
}